

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Minefield_Data_PDU::SetMines
          (Minefield_Data_PDU *this,
          vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_> *M)

{
  KUINT16 *pKVar1;
  pointer pMVar2;
  KBOOL KVar3;
  KUINT16 KVar4;
  KException *this_00;
  pointer pMVar5;
  KString local_50;
  
  pMVar5 = (M->super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (M->super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pMVar5 != pMVar2) {
    do {
      KVar3 = DATA_TYPE::MinefieldDataFilter::operator!=
                        (&pMVar5->super_MinefieldDataFilter,&this->m_DataFilter);
      if (KVar3) {
        this_00 = (KException *)__cxa_allocate_exception(0x30);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SetMines","");
        KException::KException<char_const*>
                  (this_00,&local_50,10,
                   "One or more mines do not have the correct filters.\t\t\t\t                                                                They must have the same filter as the PDU MinefieldDataFilter.\t                                                                This set request has been ignored"
                  );
        __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
      }
      pMVar5 = pMVar5 + 1;
    } while (pMVar5 != pMVar2);
  }
  std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::operator=
            (&this->m_vMines,M);
  this->m_ui8NumMines =
       (char)((uint)(*(int *)&(M->
                              super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(M->
                             super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x49;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength =
       (ushort)this->m_ui8NumSensTyp * 2 + 0x2c;
  pMVar2 = (this->m_vMines).
           super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (pMVar5 = (this->m_vMines).
                super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>.
                _M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar2; pMVar5 = pMVar5 + 1) {
    KVar4 = DATA_TYPE::Mine::GetLength(pMVar5);
    pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + KVar4;
  }
  return;
}

Assistant:

void Minefield_Data_PDU::SetMines(const std::vector<Mine> &M) noexcept(false)
{
    // First check the mines all have the same optional fields set as MinefieldDataFilter.
    vector<Mine>::const_iterator citr = M.begin();
    vector<Mine>::const_iterator citrEnd = M.end();
    for( ; citr != citrEnd; ++citr )
    {
        if( citr->MinefieldDataFilter::operator != ( m_DataFilter ) )
        {
            throw KException( __FUNCTION__, INVALID_OPERATION, "One or more mines do not have the correct filters.				\
                                                                They must have the same filter as the PDU MinefieldDataFilter.	\
                                                                This set request has been ignored" );
        }
    }

    m_vMines = M;
    m_ui8NumMines = M.size();

    // Calculate the new size
    m_ui16PDULength = MINEFIELD_DATA_PDU_SIZE + ( m_ui8NumSensTyp * 2 );
    citr = m_vMines.begin();
    citrEnd = m_vMines.end();
    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += citr->GetLength();
    }
}